

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

bool __thiscall
QMainWindowLayoutState::checkFormat(QMainWindowLayoutState *this,QDataStream *stream)

{
  byte bVar1;
  bool bVar2;
  QArrayData *pQVar3;
  long in_FS_OFFSET;
  uchar marker;
  QDockAreaLayoutInfo info;
  QList<QDockWidget_*> local_e8;
  QRect local_c8;
  byte local_a9;
  undefined1 local_a8 [40];
  undefined1 *puStack_80;
  undefined1 *local_78;
  QMainWindow *pQStack_70;
  QArrayDataPointer<QDockAreaLayoutItem> local_68;
  undefined1 *puStack_50;
  QTabBar *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QDataStream::atEnd();
  if (bVar1 != 0) {
switchD_00439803_caseD_fa:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (bool)(bVar1 & 1);
    }
    __stack_chk_fail();
  }
  do {
    local_a9 = 0xaa;
    QDataStream::operator>>(stream,&local_a9);
    switch(local_a9) {
    case 0xf9:
      local_c8.x1.m_i = 0;
      local_c8.y1.m_i = 0;
      local_c8.x2.m_i = -1;
      local_c8.y2.m_i = -1;
      ::operator>>(stream,&local_c8);
      local_48 = (QTabBar *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QMainWindow *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDockAreaLayoutInfo::QDockAreaLayoutInfo((QDockAreaLayoutInfo *)local_a8);
      local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
      allMyDockWidgets(&local_e8,&this->mainWindow->super_QWidget);
      bVar2 = QDockAreaLayoutInfo::restoreState
                        ((QDockAreaLayoutInfo *)local_a8,stream,&local_e8,true);
      if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,8,0x10);
        }
      }
      QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_68);
      if ((QArrayData *)local_a8._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        pQVar3 = (QArrayData *)local_a8._8_8_;
        if ((((QBasicAtomicInt *)local_a8._8_8_)->_q_value).super___atomic_base<int>._M_i != 0)
        goto LAB_0043998d;
        goto LAB_0043997e;
      }
      goto LAB_0043998d;
    default:
      goto switchD_00439803_caseD_fa;
    case 0xfc:
    case 0xfe:
      local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      findChildrenHelper<QToolBar*>((QList<QToolBar_*> *)local_a8,(QObject *)this->mainWindow);
      bVar2 = QToolBarAreaLayout::restoreState
                        (&this->toolBarAreaLayout,stream,(QList<QToolBar_*> *)local_a8,local_a9,true
                        );
      break;
    case 0xfd:
      local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      allMyDockWidgets((QList<QDockWidget_*> *)local_a8,&this->mainWindow->super_QWidget);
      bVar2 = QDockAreaLayout::restoreState
                        (&this->dockAreaLayout,stream,(QList<QDockWidget_*> *)local_a8,true);
    }
    if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      pQVar3 = (QArrayData *)local_a8._0_8_;
      if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
LAB_0043997e:
        QArrayData::deallocate(pQVar3,8,0x10);
      }
    }
LAB_0043998d:
    if ((bVar2 == false) || (bVar1 = QDataStream::atEnd(), bVar1 != 0))
    goto switchD_00439803_caseD_fa;
  } while( true );
}

Assistant:

bool QMainWindowLayoutState::checkFormat(QDataStream &stream)
{
    while (!stream.atEnd()) {
        uchar marker;
        stream >> marker;
        switch(marker)
        {
#if QT_CONFIG(toolbar)
            case QToolBarAreaLayout::ToolBarStateMarker:
            case QToolBarAreaLayout::ToolBarStateMarkerEx:
                {
                    QList<QToolBar *> toolBars = findChildrenHelper<QToolBar*>(mainWindow);
                    if (!toolBarAreaLayout.restoreState(stream, toolBars, marker, true /*testing*/)) {
                            return false;
                    }
                }
                break;
#endif // QT_CONFIG(toolbar)

#if QT_CONFIG(dockwidget)
            case QDockAreaLayout::DockWidgetStateMarker:
                {
                    const auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!dockAreaLayout.restoreState(stream, dockWidgets, true /*testing*/)) {
                        return false;
                    }
                }
                break;
#if QT_CONFIG(tabbar)
            case QDockAreaLayout::FloatingDockWidgetTabMarker:
                {
                    QRect geom;
                    stream >> geom;
                    QDockAreaLayoutInfo info;
                    auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!info.restoreState(stream, dockWidgets, true /* testing*/))
                        return false;
                }
                break;
#endif // QT_CONFIG(tabbar)
#endif // QT_CONFIG(dockwidget)
            default:
                //there was an error during the parsing
                return false;
        }// switch
    } //while

    //everything went fine: it must be a pre-4.3 saved state
    return true;
}